

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O1

void __thiscall
MxxColl_ScatterGeneral_Test::~MxxColl_ScatterGeneral_Test(MxxColl_ScatterGeneral_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MxxColl, ScatterGeneral) {
    mxx::comm c = MPI_COMM_WORLD;

    std::vector<int> vec;
    size_t msgsize = 5;

    // scatter from 0
    if (c.rank() == 0) {
        vec.resize(c.size()*msgsize);
        for (int i = 0; i < c.size(); ++i) {
            for (size_t j = 0; j < msgsize; ++j)
            {
                vec[i*msgsize + j] = 2*j + 3*i;
            }
        }
    }
    std::vector<int> result(msgsize);
    mxx::scatter(&vec[0], msgsize, &result.front(), 0, c);
    for (int j = 0; j < (int)msgsize; ++j) {
        ASSERT_EQ(2*j+3*c.rank(), result[j]);
    }
}